

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# publication.cpp
# Opt level: O2

CallResult __thiscall miniros::PeerConnDisconnCallback::call(PeerConnDisconnCallback *this)

{
  CallResult CVar1;
  SingleSubscriberPublisher pub;
  VoidConstPtr tracker;
  
  tracker.super___shared_ptr<const_void,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  tracker.super___shared_ptr<const_void,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if (this->use_tracked_object_ == true) {
    std::__shared_ptr<const_void,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<const_void,_(__gnu_cxx::_Lock_policy)2> *)&pub,&this->tracked_object_);
    std::__shared_ptr<const_void,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&tracker.super___shared_ptr<const_void,_(__gnu_cxx::_Lock_policy)2>,
               (__shared_ptr<const_void,_(__gnu_cxx::_Lock_policy)2> *)&pub);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&pub.link_.super___shared_ptr<miniros::SubscriberLink,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    if (tracker.super___shared_ptr<const_void,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0) {
      CVar1 = Invalid;
      goto LAB_0023d652;
    }
  }
  SingleSubscriberPublisher::SingleSubscriberPublisher(&pub,&this->sub_link_);
  std::function<void_(const_miniros::SingleSubscriberPublisher_&)>::operator()
            (&this->callback_,&pub);
  SingleSubscriberPublisher::~SingleSubscriberPublisher(&pub);
  CVar1 = Success;
LAB_0023d652:
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&tracker.super___shared_ptr<const_void,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return CVar1;
}

Assistant:

virtual CallResult call()
  {
    VoidConstPtr tracker;
    if (use_tracked_object_)
    {
      tracker = tracked_object_.lock();

      if (!tracker)
      {
        return Invalid;
      }
    }

    SingleSubscriberPublisher pub(sub_link_);
    callback_(pub);

    return Success;
  }